

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O1

bool __thiscall QSQLiteDriver::unsubscribeFromNotification(QSQLiteDriver *this,QString *name)

{
  long lVar1;
  char cVar2;
  QStringView QVar3;
  
  lVar1 = *(long *)(this + 8);
  cVar2 = (**(code **)(*(long *)this + 0x60))();
  if (cVar2 == '\0') {
    lcSqlite();
    if (((byte)lcSqlite::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      unsubscribeFromNotification();
    }
  }
  else {
    QVar3.m_data = (name->d).ptr;
    QVar3.m_size = (name->d).size;
    cVar2 = QtPrivate::QStringList_contains((QList *)(lVar1 + 200),QVar3,CaseSensitive);
    if (cVar2 != '\0') {
      QtPrivate::sequential_erase_with_copy<QList<QString>,QString>
                ((QList<QString> *)(lVar1 + 200),name);
      if (*(long *)(lVar1 + 0xd8) != 0) {
        return true;
      }
      sqlite3_update_hook(*(sqlite3 **)(lVar1 + 0xa8),
                          (_func_void_void_ptr_int_char_ptr_char_ptr_sqlite_int64 *)0x0,(void *)0x0)
      ;
      return true;
    }
    lcSqlite();
    if (((byte)lcSqlite::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      unsubscribeFromNotification();
    }
  }
  return false;
}

Assistant:

bool QSQLiteDriver::unsubscribeFromNotification(const QString &name)
{
    Q_D(QSQLiteDriver);
    if (!isOpen()) {
        qCWarning(lcSqlite, "QSQLiteDriver::unsubscribeFromNotification: Database not open.");
        return false;
    }

    if (!d->notificationid.contains(name)) {
        qCWarning(lcSqlite, "QSQLiteDriver::unsubscribeFromNotification: Not subscribed to '%ls'.",
                  qUtf16Printable(name));
        return false;
    }

    d->notificationid.removeAll(name);
    if (d->notificationid.isEmpty())
        sqlite3_update_hook(d->access, nullptr, nullptr);

    return true;
}